

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O2

ScriptPtr __thiscall
Jinx::Impl::Runtime::CreateScript(Runtime *this,BufferPtr *bytecode,Any *userContext)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  any *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ScriptPtr SVar2;
  undefined1 local_59;
  shared_ptr<Jinx::Buffer> local_58;
  __shared_ptr<Jinx::Impl::Runtime,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  _func_int **local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  std::__shared_ptr<Jinx::Impl::Runtime,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Jinx::Impl::Runtime,void>
            (local_48,(__weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2> *)
                      &(bytecode->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount);
  std::static_pointer_cast<Jinx::Buffer,Jinx::Buffer>(&local_58);
  std::__shared_ptr<Jinx::Impl::Script,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Jinx::Allocator<Jinx::Impl::Script>,std::shared_ptr<Jinx::Impl::Runtime>,std::shared_ptr<Jinx::Buffer>,std::any&>
            ((__shared_ptr<Jinx::Impl::Script,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (Allocator<Jinx::Impl::Script> *)&local_59,(shared_ptr<Jinx::Impl::Runtime> *)local_48,
             &local_58,in_RCX);
  _Var1._M_pi = _Stack_30._M_pi;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_IRuntime)._vptr_IRuntime = local_38;
  (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
  super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_38 = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  SVar2.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar2.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ScriptPtr)SVar2.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline_t ScriptPtr Runtime::CreateScript(BufferPtr bytecode, Any userContext)
	{
		return std::allocate_shared<Script>(Allocator<Script>(), shared_from_this(), std::static_pointer_cast<Buffer>(bytecode), userContext);
	}